

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(JobParseT *this,WorkerT *wrk,MetaT *meta)

{
  undefined1 this_00 [8];
  bool bVar1;
  string macroName;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> local_b0;
  undefined1 local_a8 [8];
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  MocSettingsT::FindMacro(&local_40,&wrk->Gen_->Moc_,&meta->Content);
  if (local_40._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string((string *)&local_60,(string *)&this->FileName);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_a0 = local_98._M_local_buf + 8;
    local_98._M_allocated_capacity = 0;
    local_98._M_local_buf[8] = '\0';
    std::
    make_unique<cmQtAutoGeneratorMocUic::JobMocT,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               &local_60,&local_80);
    this_00 = local_a8;
    local_b0._M_head_impl = (JobT *)local_a8;
    local_a8 = (undefined1  [8])0x0;
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    JobMocT::FindDependencies((JobMocT *)this_00,wrk,&meta->Content);
    bVar1 = ParallelJobPushMoc(wrk->Gen_,(JobHandleT *)&local_b0);
    if ((JobMocT *)local_b0._M_head_impl != (JobMocT *)0x0) {
      (*((JobT *)&(local_b0._M_head_impl)->_vptr_JobT)->_vptr_JobT[1])();
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(WorkerT& wrk,
                                                        MetaT const& meta)
{
  bool success = true;
  std::string const macroName = wrk.Moc().FindMacro(meta.Content);
  if (!macroName.empty()) {
    JobHandleT jobHandle = cm::make_unique<JobMocT>(
      std::string(FileName), std::string(), std::string());
    // Read dependencies from this source
    static_cast<JobMocT&>(*jobHandle).FindDependencies(wrk, meta.Content);
    success = wrk.Gen().ParallelJobPushMoc(jobHandle);
  }
  return success;
}